

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O1

string * __thiscall
kaitai::kstream::read_bytes_term_abi_cxx11_
          (string *__return_storage_ptr__,kstream *this,char term,bool include,bool consume,
          bool eos_error)

{
  runtime_error *this_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (this->m_io,(string *)__return_storage_ptr__,term);
  if (((&this->m_io->field_0x20)[(long)this->m_io->_vptr_basic_istream[-3]] & 2) == 0) {
    if (include) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    if (!consume) {
      std::istream::unget();
    }
  }
  else if (eos_error) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"read_bytes_term: encountered EOF");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string kaitai::kstream::read_bytes_term(char term, bool include, bool consume, bool eos_error) {
    std::string result;
    std::getline(*m_io, result, term);
    if (m_io->eof()) {
        // encountered EOF
        if (eos_error) {
            throw std::runtime_error("read_bytes_term: encountered EOF");
        }
    } else {
        // encountered terminator
        if (include)
            result.push_back(term);
        if (!consume)
            m_io->unget();
    }
    return result;
}